

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.hpp
# Opt level: O0

void __thiscall boost::uuids::detail::sha1::process_block(sha1 *this)

{
  uint uVar1;
  int iVar2;
  uint *in_RDI;
  uint temp;
  uint k;
  uint f;
  size_t i_2;
  uint e;
  uint d;
  uint c;
  uint b;
  uint a;
  size_t i_1;
  size_t i;
  uint w [80];
  uint auStack_188 [4];
  ulong local_178;
  uint local_16c;
  uint local_168 [4];
  undefined8 local_158;
  ulong local_150;
  uint auStack_148 [82];
  
  for (local_150 = 0; local_150 < 0x10; local_150 = local_150 + 1) {
    auStack_148[local_150] = (uint)(byte)in_RDI[local_150 + 5] << 0x18;
    auStack_148[local_150] =
         (uint)*(byte *)((long)in_RDI + local_150 * 4 + 0x15) << 0x10 | auStack_148[local_150];
    auStack_148[local_150] =
         (uint)*(byte *)((long)in_RDI + local_150 * 4 + 0x16) << 8 | auStack_148[local_150];
    auStack_148[local_150] =
         (uint)*(byte *)((long)in_RDI + local_150 * 4 + 0x17) | auStack_148[local_150];
  }
  for (local_158 = 0x10; local_158 < 0x50; local_158 = local_158 + 1) {
    uVar1 = left_rotate(auStack_148[local_158 - 3] ^ auStack_148[local_158 - 8] ^
                        auStack_148[local_158 - 0xe] ^ auStack_148[local_158 - 0x10],1);
    auStack_148[local_158] = uVar1;
  }
  local_168[2] = in_RDI[1];
  local_168[1] = in_RDI[2];
  local_168[0] = in_RDI[3];
  local_16c = in_RDI[4];
  local_168[3] = *in_RDI;
  for (local_178 = 0; local_178 < 0x50; local_178 = local_178 + 1) {
    if (local_178 < 0x14) {
      auStack_188[3] = local_168[2] & local_168[1] | (local_168[2] ^ 0xffffffff) & local_168[0];
      auStack_188[2] = 0x5a827999;
    }
    else if (local_178 < 0x28) {
      auStack_188[3] = local_168[2] ^ local_168[1] ^ local_168[0];
      auStack_188[2] = 0x6ed9eba1;
    }
    else if (local_178 < 0x3c) {
      auStack_188[3] = local_168[2] & (local_168[1] | local_168[0]) | local_168[1] & local_168[0];
      auStack_188[2] = -0x70e44324;
    }
    else {
      auStack_188[3] = local_168[2] ^ local_168[1] ^ local_168[0];
      auStack_188[2] = -0x359d3e2a;
    }
    uVar1 = left_rotate(local_168[3],5);
    iVar2 = uVar1 + auStack_188[3] + local_16c;
    uVar1 = auStack_148[local_178];
    local_16c = local_168[0];
    local_168[0] = local_168[1];
    local_168[1] = left_rotate(local_168[2],0x1e);
    local_168[2] = local_168[3];
    local_168[3] = iVar2 + auStack_188[2] + uVar1;
  }
  *in_RDI = local_168[3] + *in_RDI;
  in_RDI[1] = local_168[2] + in_RDI[1];
  in_RDI[2] = local_168[1] + in_RDI[2];
  in_RDI[3] = local_168[0] + in_RDI[3];
  in_RDI[4] = local_16c + in_RDI[4];
  return;
}

Assistant:

inline void sha1::process_block()
{
    unsigned int w[80];
    for (std::size_t i=0; i<16; ++i) {
        w[i]  = (block_[i*4 + 0] << 24);
        w[i] |= (block_[i*4 + 1] << 16);
        w[i] |= (block_[i*4 + 2] << 8);
        w[i] |= (block_[i*4 + 3]);
    }
    for (std::size_t i=16; i<80; ++i) {
        w[i] = left_rotate((w[i-3] ^ w[i-8] ^ w[i-14] ^ w[i-16]), 1);
    }

    unsigned int a = h_[0];
    unsigned int b = h_[1];
    unsigned int c = h_[2];
    unsigned int d = h_[3];
    unsigned int e = h_[4];

    for (std::size_t i=0; i<80; ++i) {
        unsigned int f;
        unsigned int k;

        if (i<20) {
            f = (b & c) | (~b & d);
            k = 0x5A827999;
        } else if (i<40) {
            f = b ^ c ^ d;
            k = 0x6ED9EBA1;
        } else if (i<60) {
            f = (b & c) | (b & d) | (c & d);
            k = 0x8F1BBCDC;
        } else {
            f = b ^ c ^ d;
            k = 0xCA62C1D6;
        }

        unsigned temp = left_rotate(a, 5) + f + e + k + w[i];
        e = d;
        d = c;
        c = left_rotate(b, 30);
        b = a;
        a = temp;
    }

    h_[0] += a;
    h_[1] += b;
    h_[2] += c;
    h_[3] += d;
    h_[4] += e;
}